

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateUnindexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint uVar1;
  long lVar2;
  byte *pbVar3;
  ValueLength VVar4;
  ulong uVar5;
  Exception *this_00;
  long lVar6;
  char *msg;
  long lVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  size_t length_00;
  byte *local_40;
  Validator *local_38;
  
  lVar7 = 1L << (*ptr - 2 & 0x3f);
  local_38 = this;
  validateBufferLength(this,lVar7 + 2,length,true);
  switch(lVar7) {
  case 1:
    uVar5 = (ulong)ptr[1];
    break;
  case 2:
    uVar5 = (ulong)*(ushort *)(ptr + 1);
    break;
  case 3:
    uVar9 = (ulong)ptr[1];
    uVar5 = (ulong)*(ushort *)(ptr + 2) << 8;
    goto LAB_001040f7;
  case 4:
    uVar5 = (ulong)*(uint *)(ptr + 1);
    break;
  case 5:
    uVar1 = *(uint *)(ptr + 1);
    uVar5 = (ulong)ptr[5];
    goto LAB_001040f3;
  case 6:
    uVar1 = *(uint *)(ptr + 1);
    uVar5 = (ulong)*(ushort *)(ptr + 5);
LAB_001040f3:
    uVar9 = (ulong)uVar1;
    uVar5 = uVar5 << 0x20;
LAB_001040f7:
    uVar5 = uVar5 | uVar9;
    break;
  case 7:
    uVar5 = (ulong)*(uint7 *)(ptr + 1);
    break;
  case 8:
    uVar5 = *(ulong *)(ptr + 1);
    break;
  default:
    uVar5 = 0;
    pbVar3 = ptr;
    goto LAB_0010412d;
  }
  if (length < uVar5) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
  }
  else {
    uVar9 = 9;
    if ((long)uVar5 < 9) {
      uVar9 = uVar5;
    }
    pbVar3 = ptr + uVar9;
LAB_0010412d:
    lVar8 = lVar7 + 1;
    lVar6 = lVar8;
    pbVar10 = ptr + lVar7 + 1;
    if (ptr + lVar7 + 1 < pbVar3) {
      lVar6 = (long)pbVar3 - (long)ptr;
      lVar7 = lVar8;
      do {
        if (ptr[lVar7] != '\0') {
          lVar6 = lVar7;
          pbVar10 = ptr + lVar7;
          break;
        }
        lVar2 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        pbVar10 = pbVar3;
      } while (ptr + lVar2 < pbVar3);
    }
    uVar9 = uVar5 - lVar6;
    if (uVar9 == 0 || (long)uVar5 < lVar6) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array structure is invalid";
    }
    else if (lVar6 == 9 || lVar6 == lVar8) {
      validatePart(local_38,pbVar10,length - lVar6,true);
      VVar4 = (ValueLength)"\x01\x01"[*pbVar10];
      local_40 = pbVar10;
      if ((VVar4 == 0) &&
         (VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_40,pbVar10), VVar4 == 0)) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array itemSize value is invalid";
      }
      else if (uVar9 < VVar4) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array nrItems value is invalid";
      }
      else {
        uVar9 = uVar9 / VVar4;
        pbVar10 = pbVar10 + VVar4;
        length_00 = (long)(ptr + length) - (long)pbVar10;
        do {
          uVar9 = uVar9 - 1;
          if (uVar9 == 0) {
            return;
          }
          if (ptr + length <= pbVar10) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            msg = "Array value is out of bounds";
            goto LAB_00104282;
          }
          validatePart(local_38,pbVar10,length_00,true);
          uVar5 = (ulong)"\x01\x01"[*pbVar10];
          local_40 = pbVar10;
          if (uVar5 == 0) {
            uVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&local_40,pbVar10);
          }
          pbVar10 = pbVar10 + VVar4;
          length_00 = length_00 - VVar4;
        } while (uVar5 == VVar4);
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unexpected Array value length";
      }
    }
    else {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array padding is invalid";
    }
  }
LAB_00104282:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateUnindexedArray(uint8_t const* ptr, std::size_t length) {
  // Array without index table, with 1-8 bytes lengths, all values with same
  // length
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x02U);
  validateBufferLength(1 + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  // look up first member
  uint8_t const* p = ptr + 1 + byteSizeLength;
  uint8_t const* e = p + (8 - byteSizeLength);

  if (e > ptr + byteSize) {
    e = ptr + byteSize;
  }
  while (p < e && *p == '\x00') {
    ++p;
  }

  if (p >= ptr + byteSize) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array structure is invalid");
  }

  // check if padding is correct
  if (p != ptr + 1 + byteSizeLength &&
      p != ptr + 1 + byteSizeLength + (8 - byteSizeLength)) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array padding is invalid");
  }

  validatePart(p, length - (p - ptr), true);
  ValueLength itemSize = Slice(p).byteSize();
  if (itemSize == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array itemSize value is invalid");
  }
  ValueLength nrItems = (byteSize - (p - ptr)) / itemSize;

  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array nrItems value is invalid");
  }
  // we already validated p, so move it forward
  p += itemSize;
  e = ptr + length;
  --nrItems;

  while (nrItems > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array value is out of bounds");
    }
    // validate sub value
    validatePart(p, e - p, true);
    if (Slice(p).byteSize() != itemSize) {
      // got a sub-object with a different size. this is not allowed
      throw Exception(Exception::ValidatorInvalidLength,
                      "Unexpected Array value length");
    }
    p += itemSize;
    --nrItems;
  }
}